

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::DeregisterTempMap(CConsole *this,char *pName)

{
  int iVar1;
  CChunk *pCVar2;
  CChunk *pCVar3;
  CHeap *in_RDI;
  CMapListEntryTemp *pDst;
  CMapListEntryTemp *pSrc;
  CMapListEntryTemp *pNewLastEntry;
  CMapListEntryTemp *pNewFirstEntry;
  CHeap *pNewTempMapListHeap;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  CChunk *pCVar4;
  CChunk *local_40;
  
  if (in_RDI[0x1d].m_pCurrent != (CChunk *)0x0) {
    pCVar2 = (CChunk *)operator_new(8);
    CHeap::CHeap((CHeap *)0x145405);
    pCVar4 = pCVar2;
    for (local_40 = in_RDI[0x1d].m_pCurrent; local_40 != (CChunk *)0x0;
        local_40 = (CChunk *)local_40->m_pCurrent) {
      iVar1 = str_comp_nocase(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (iVar1 != 0) {
        pCVar3 = (CChunk *)CHeap::Allocate(in_RDI,(uint)((ulong)pCVar4 >> 0x20));
        pCVar3->m_pCurrent = (char *)0x0;
        pCVar3->m_pMemory = (char *)in_RDI[0x1e].m_pCurrent;
        if (pCVar3->m_pMemory != (char *)0x0) {
          *(CChunk **)(pCVar3->m_pMemory + 8) = pCVar3;
        }
        in_RDI[0x1e].m_pCurrent = pCVar3;
        if (in_RDI[0x1d].m_pCurrent == (CChunk *)0x0) {
          in_RDI[0x1d].m_pCurrent = pCVar3;
        }
        str_copy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
      }
    }
    pCVar4 = in_RDI[0x1c].m_pCurrent;
    if (pCVar4 != (CChunk *)0x0) {
      CHeap::~CHeap((CHeap *)0x145553);
      operator_delete(pCVar4,8);
    }
    in_RDI[0x1c].m_pCurrent = pCVar2;
    in_RDI[0x1d].m_pCurrent = (CChunk *)0x0;
    in_RDI[0x1e].m_pCurrent = (CChunk *)0x0;
  }
  return;
}

Assistant:

void CConsole::DeregisterTempMap(const char *pName)
{
	if(!m_pFirstMapEntry)
		return;

	CHeap *pNewTempMapListHeap = new CHeap();
	CMapListEntryTemp *pNewFirstEntry = 0;
	CMapListEntryTemp *pNewLastEntry = 0;

	for(CMapListEntryTemp *pSrc = m_pFirstMapEntry; pSrc; pSrc = pSrc->m_pNext)
	{
		if(str_comp_nocase(pName, pSrc->m_aName) == 0)
			continue;

		CMapListEntryTemp *pDst = (CMapListEntryTemp *)pNewTempMapListHeap->Allocate(sizeof(CMapListEntryTemp));
		pDst->m_pNext = 0;
		pDst->m_pPrev = m_pLastMapEntry;
		if(pDst->m_pPrev)
			pDst->m_pPrev->m_pNext = pDst;
		m_pLastMapEntry = pDst;
		if(!m_pFirstMapEntry)
			m_pFirstMapEntry = pDst;

		str_copy(pDst->m_aName, pSrc->m_aName, TEMPMAP_NAME_LENGTH);
	}

	delete m_pTempMapListHeap;
	m_pTempMapListHeap = pNewTempMapListHeap;
	m_pFirstMapEntry = pNewFirstEntry;
	m_pLastMapEntry = pNewLastEntry;
}